

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::clean(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
        *this,Lit *idx)

{
  bool bVar1;
  Size SVar2;
  vec<Minisat::Solver::Watcher,_int> *this_00;
  Watcher *pWVar3;
  Watcher *pWVar4;
  char *pcVar5;
  int local_2c;
  int local_28;
  int j;
  int i;
  vec<Minisat::Solver::Watcher,_int> *vec;
  Lit *idx_local;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  *this_local;
  
  this_00 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>::
            operator[](&this->occs,(Lit)idx->x);
  local_2c = 0;
  local_28 = 0;
  while( true ) {
    SVar2 = vec<Minisat::Solver::Watcher,_int>::size(this_00);
    if (SVar2 <= local_28) break;
    pWVar3 = vec<Minisat::Solver::Watcher,_int>::operator[](this_00,local_28);
    bVar1 = Solver::WatcherDeleted::operator()(&this->deleted,pWVar3);
    if (!bVar1) {
      pWVar3 = vec<Minisat::Solver::Watcher,_int>::operator[](this_00,local_28);
      pWVar4 = vec<Minisat::Solver::Watcher,_int>::operator[](this_00,local_2c);
      *pWVar4 = *pWVar3;
      local_2c = local_2c + 1;
    }
    local_28 = local_28 + 1;
  }
  vec<Minisat::Solver::Watcher,_int>::shrink(this_00,local_28 - local_2c);
  pcVar5 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[](&this->dirty,(Lit)idx->x);
  *pcVar5 = '\0';
  return;
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}